

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O0

int __thiscall
icu_63::CurrencyPluralInfo::clone
          (CurrencyPluralInfo *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UBool UVar1;
  CurrencyPluralInfo *this_00;
  CurrencyPluralInfo *local_38;
  int local_18;
  CurrencyPluralInfo *newObj;
  CurrencyPluralInfo *this_local;
  
  this_00 = (CurrencyPluralInfo *)UMemory::operator_new((UMemory *)0x28,(size_t)__fn);
  local_38 = (CurrencyPluralInfo *)0x0;
  if (this_00 != (CurrencyPluralInfo *)0x0) {
    CurrencyPluralInfo(this_00,this);
    local_38 = this_00;
  }
  local_18 = (int)local_38;
  if (local_38 != (CurrencyPluralInfo *)0x0) {
    UVar1 = ::U_FAILURE(local_38->fInternalStatus);
    if (UVar1 != '\0') {
      if (local_38 != (CurrencyPluralInfo *)0x0) {
        (*(local_38->super_UObject)._vptr_UObject[1])();
      }
      local_18 = 0;
    }
  }
  return local_18;
}

Assistant:

CurrencyPluralInfo*
CurrencyPluralInfo::clone() const {
    CurrencyPluralInfo* newObj = new CurrencyPluralInfo(*this);
    // Since clone doesn't have a 'status' parameter, the best we can do is return nullptr
    // if the new object was not full constructed properly (an error occurred).
    if (newObj != nullptr && U_FAILURE(newObj->fInternalStatus)) {
        delete newObj;
        newObj = nullptr;
    }
    return newObj;
}